

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi.cpp
# Opt level: O0

void adl_setHVibrato(ADL_MIDIPlayer *device,int hvibro)

{
  void *pvVar1;
  bool bVar2;
  OPL3 *this;
  byte local_29;
  Synth *synth;
  MidiPlayer *play;
  int hvibro_local;
  ADL_MIDIPlayer *device_local;
  
  if (device != (ADL_MIDIPlayer *)0x0) {
    pvVar1 = device->adl_midiPlayer;
    if (pvVar1 == (void *)0x0) {
      __assert_fail("play",
                    "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libADLMIDI/src/adlmidi.cpp"
                    ,0x1ec,"void adl_setHVibrato(ADL_MIDIPlayer *, int)");
    }
    this = AdlMIDI_UPtr<OPL3,_ADLMIDI_DefaultDelete<OPL3>_>::operator*
                     ((AdlMIDI_UPtr<OPL3,_ADLMIDI_DefaultDelete<OPL3>_> *)((long)pvVar1 + 0x198));
    *(int *)((long)pvVar1 + 0x11b8) = hvibro;
    bVar2 = OPL3::setupLocked(this);
    if (!bVar2) {
      if (*(int *)((long)pvVar1 + 0x11b8) < 0) {
        local_29 = (this->m_insBankSetup).deepVibrato;
      }
      else {
        local_29 = *(int *)((long)pvVar1 + 0x11b8) != 0;
      }
      this->m_deepVibratoMode = (bool)(local_29 & 1);
      OPL3::commitDeepFlags(this);
    }
  }
  return;
}

Assistant:

ADLMIDI_EXPORT void adl_setHVibrato(ADL_MIDIPlayer *device, int hvibro)
{
    if(!device) return;
    MidiPlayer *play = GET_MIDI_PLAYER(device);
    assert(play);
    Synth &synth = *play->m_synth;
    play->m_setup.deepVibratoMode = hvibro;
    if(!synth.setupLocked())
    {
        synth.m_deepVibratoMode     = play->m_setup.deepVibratoMode < 0 ?
                                        synth.m_insBankSetup.deepVibrato :
                                        (play->m_setup.deepVibratoMode != 0);
        synth.commitDeepFlags();
    }
}